

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<std::vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>&,pybind11::iterable>
::load_impl_sequence<0ul,1ul>(void *param_1,long param_2)

{
  reference pvVar1;
  handle hVar2;
  const_iterator pbVar3;
  const_iterator pbVar4;
  reference rVar5;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  type_caster_generic *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  size_type in_stack_ffffffffffffff88;
  undefined1 uVar6;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  reference local_50;
  PyObject *local_40;
  bool local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<std::vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>,void>,pybind11::detail::type_caster<pybind11::iterable,void>>
            ((tuple<pybind11::detail::type_caster<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>,_void>,_pybind11::detail::type_caster<pybind11::iterable,_void>_>
              *)0x328619);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  hVar2.m_ptr._7_1_ = in_stack_ffffffffffffff87;
  hVar2.m_ptr._0_7_ = in_stack_ffffffffffffff80;
  local_32 = type_caster_generic::load
                       (in_stack_ffffffffffffff78,hVar2,SUB81((ulong)param_1 >> 0x38,0));
  std::
  get<1ul,pybind11::detail::type_caster<std::vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>,void>,pybind11::detail::type_caster<pybind11::iterable,void>>
            ((tuple<pybind11::detail::type_caster<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>,_void>,_pybind11::detail::type_caster<pybind11::iterable,_void>_>
              *)0x328687);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),1);
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  hVar2.m_ptr = (PyObject *)rVar5._M_p;
  uVar6 = (undefined1)(in_stack_ffffffffffffff88 >> 0x38);
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff98);
  local_31 = pyobject_caster<pybind11::iterable>::load<pybind11::iterable,_0>
                       ((pyobject_caster<pybind11::iterable> *)in_stack_ffffffffffffff90,hVar2,
                        (bool)uVar6);
  local_30._M_array = &local_32;
  local_30._M_len = 2;
  local_20 = &local_30;
  pbVar3 = std::initializer_list<bool>::begin(local_20);
  pbVar4 = std::initializer_list<bool>::end((initializer_list<bool> *)param_1);
  while( true ) {
    if (pbVar3 == pbVar4) {
      return true;
    }
    if ((*pbVar3 & 1U) == 0) break;
    pbVar3 = pbVar3 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }